

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

size_t sysbvm_tuple_hash(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  sysbvm_tuple_t sVar1;
  size_t sVar2;
  sysbvm_tuple_t local_18;
  
  sVar1 = sysbvm_tuple_getType(context,tuple);
  if (sVar1 != 0) {
    sVar1 = sysbvm_type_getHashFunction(context,sVar1);
    if (sVar1 != 0) {
      local_18 = tuple;
      sVar1 = sysbvm_function_apply(context,sVar1,1,&local_18,0);
      if (sVar1 == 0 || (sVar1 & 0xf) != 0) {
        sVar2 = (long)sVar1 >> 4;
      }
      else {
        sVar2 = *(size_t *)(sVar1 + 0x10);
      }
      return sVar2;
    }
  }
  sVar2 = sysbvm_tuple_identityHash(tuple);
  return sVar2;
}

Assistant:

SYSBVM_API size_t sysbvm_tuple_hash(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type)
    {
        sysbvm_tuple_t hashFunction = sysbvm_type_getHashFunction(context, type);
        if(hashFunction)
            return sysbvm_tuple_size_decode(sysbvm_function_apply1(context, hashFunction, tuple));
    }

    return sysbvm_tuple_identityHash(tuple);
}